

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

ggml_tensor * __thiscall llm_graph_context::build_inp_pos_bucket_enc(llm_graph_context *this)

{
  pointer plVar1;
  ggml_tensor *pgVar2;
  pointer __u;
  long in_RDI;
  ggml_tensor **cur;
  __single_object inp;
  llm_graph_input_ptr *in_stack_ffffffffffffff98;
  llm_graph_result *in_stack_ffffffffffffffa0;
  unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> local_30 [3];
  ggml_tensor **local_18;
  
  std::make_unique<llm_graph_input_pos_bucket,llama_hparams_const&>
            ((llama_hparams *)&stack0xfffffffffffffff0);
  plVar1 = std::
           unique_ptr<llm_graph_input_pos_bucket,_std::default_delete<llm_graph_input_pos_bucket>_>
           ::operator->((unique_ptr<llm_graph_input_pos_bucket,_std::default_delete<llm_graph_input_pos_bucket>_>
                         *)0x4351e0);
  local_18 = &plVar1->pos_bucket;
  pgVar2 = (ggml_tensor *)
           ggml_new_tensor_2d(*(undefined8 *)(in_RDI + 0xc0),0x1a,(long)*(int *)(in_RDI + 0xa8));
  *local_18 = pgVar2;
  ggml_set_input(*local_18);
  __u = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                  ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)0x435240)
  ;
  std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>::
  unique_ptr<llm_graph_input_pos_bucket,std::default_delete<llm_graph_input_pos_bucket>,void>
            (local_30,(unique_ptr<llm_graph_input_pos_bucket,_std::default_delete<llm_graph_input_pos_bucket>_>
                       *)__u);
  llm_graph_result::add_input(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>::~unique_ptr
            ((unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)
             in_stack_ffffffffffffffa0);
  pgVar2 = *local_18;
  std::unique_ptr<llm_graph_input_pos_bucket,_std::default_delete<llm_graph_input_pos_bucket>_>::
  ~unique_ptr((unique_ptr<llm_graph_input_pos_bucket,_std::default_delete<llm_graph_input_pos_bucket>_>
               *)pgVar2);
  return pgVar2;
}

Assistant:

ggml_tensor * llm_graph_context::build_inp_pos_bucket_enc() const {
    auto inp = std::make_unique<llm_graph_input_pos_bucket>(hparams);

    auto & cur = inp->pos_bucket;

    cur = ggml_new_tensor_2d(ctx0, GGML_TYPE_I32, n_tokens, n_tokens);
    ggml_set_input(cur);

    res->add_input(std::move(inp));

    return cur;
}